

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

int cPow(int x,int n)

{
  undefined4 local_18;
  undefined4 local_14;
  int r;
  int i;
  int n_local;
  int x_local;
  
  local_18 = 1;
  for (local_14 = 0; local_14 < n; local_14 = local_14 + 1) {
    local_18 = local_18 * x;
  }
  return local_18;
}

Assistant:

procedure 
int cPow(int x, int n) {
	variable int i; variable int r;
	r = 1; i = 0;
	while (i < n) {
		r = r * x;
		i = i + 1;
	}
	return r;
}